

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UChar * CReg::get(char *id)

{
  int iVar1;
  CReg *pCVar2;
  UChar *pUVar3;
  
  umtx_lock_63(&gCRegLock);
  pCVar2 = gCRegHead;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  do {
    if (pCVar2 == (CReg *)0x0) {
      pUVar3 = (UChar *)0x0;
LAB_002c92d5:
      umtx_unlock_63(&gCRegLock);
      return pUVar3;
    }
    iVar1 = strcmp(id,pCVar2->id);
    if (iVar1 == 0) {
      pUVar3 = pCVar2->iso;
      goto LAB_002c92d5;
    }
    pCVar2 = pCVar2->next;
  } while( true );
}

Assistant:

static const UChar* get(const char* id) {
        const UChar* result = NULL;
        umtx_lock(&gCRegLock);
        CReg* p = gCRegHead;

        /* register cleanup of the mutex */
        ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        while (p) {
            if (uprv_strcmp(id, p->id) == 0) {
                result = p->iso;
                break;
            }
            p = p->next;
        }
        umtx_unlock(&gCRegLock);
        return result;
    }